

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O3

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B,int n,int k)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  uVar13 = (ulong)(uint)k;
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,uVar13 * 4);
    }
    if (0 < n) {
      uVar8 = 0;
      do {
        C._M_current[T._M_current[uVar8]] = C._M_current[T._M_current[uVar8]] + 1;
        uVar8 = uVar8 + 1;
      } while ((uint)n != uVar8);
    }
  }
  if (0 < k) {
    uVar8 = 0;
    iVar7 = 0;
    do {
      iVar1 = C._M_current[uVar8];
      B._M_current[uVar8] = iVar7;
      uVar8 = uVar8 + 1;
      iVar7 = iVar1 + iVar7;
    } while (uVar13 != uVar8);
  }
  uVar2 = n - 1;
  uVar8 = (ulong)T._M_current[(long)n + -1];
  puVar4 = (uint *)(SA._M_current + B._M_current[uVar8]);
  if (n < 2) {
    *puVar4 = uVar2;
    if (n != 1) {
      bVar3 = false;
      goto LAB_00167745;
    }
  }
  else {
    uVar12 = -n;
    if (T._M_current[(long)n + -1] <= T._M_current[(ulong)(uint)n - 2]) {
      uVar12 = uVar2;
    }
    *puVar4 = uVar12;
  }
  puVar4 = puVar4 + 1;
  uVar10 = 0;
  do {
    uVar12 = SA._M_current[uVar10];
    SA._M_current[uVar10] = ~uVar12;
    if (0 < (long)(int)uVar12) {
      uVar11 = T._M_current[uVar12 - 1];
      if (uVar11 != (uint)uVar8) {
        B._M_current[uVar8] = (int)((ulong)((long)puVar4 - (long)SA._M_current) >> 2);
        puVar4 = (uint *)(SA._M_current + B._M_current[uVar11]);
        uVar8 = (ulong)uVar11;
      }
      uVar11 = 0;
      if ((uVar12 != 1) && (uVar11 = uVar12 - 1, T._M_current[(long)(int)uVar12 + -2] < (uint)uVar8)
         ) {
        uVar11 = -uVar12;
      }
      *puVar4 = uVar11;
      puVar4 = puVar4 + 1;
    }
    uVar10 = uVar10 + 1;
  } while ((uint)n != uVar10);
  bVar3 = true;
LAB_00167745:
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,uVar13 * 4);
    }
    if (bVar3) {
      uVar8 = 0;
      do {
        C._M_current[T._M_current[uVar8]] = C._M_current[T._M_current[uVar8]] + 1;
        uVar8 = uVar8 + 1;
      } while ((uint)n != uVar8);
    }
  }
  if (0 < k) {
    uVar8 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + C._M_current[uVar8];
      B._M_current[uVar8] = iVar7;
      uVar8 = uVar8 + 1;
    } while (uVar13 != uVar8);
  }
  if (bVar3) {
    piVar9 = SA._M_current + *B._M_current;
    uVar13 = 0;
    lVar5 = (ulong)uVar2 + 1;
    do {
      uVar2 = SA._M_current[lVar5 + -1];
      uVar12 = (uint)uVar13;
      if ((long)(int)uVar2 < 1) {
        SA._M_current[lVar5 + -1] = ~uVar2;
      }
      else {
        uVar14 = uVar2 - 1;
        uVar11 = T._M_current[uVar14];
        if (uVar11 != uVar12) {
          B._M_current[uVar13] = (int)((ulong)((long)piVar9 - (long)SA._M_current) >> 2);
          piVar9 = SA._M_current + B._M_current[uVar11];
          uVar12 = uVar11;
        }
        if ((uVar14 == 0) || (uVar12 < T._M_current[(long)(int)uVar2 + -2])) {
          uVar14 = -uVar2;
        }
        piVar9[-1] = uVar14;
        piVar9 = piVar9 + -1;
      }
      uVar13 = (ulong)uVar12;
      lVar6 = lVar5 + -1;
      bVar3 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar3);
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}